

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Diag(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  int sz;
  Fad<double> pivot;
  Fad<double> local_a8;
  TPZMatrix<Fad<double>_> *local_88;
  TPZFMatrix<Fad<double>_> *local_80;
  long local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar4 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar4 != CONCAT44(extraout_var,iVar3)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
    lVar4 = 0;
    local_88 = this;
    local_80 = B;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,lVar4,lVar4);
      if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
        lVar8 = 0;
        local_78 = lVar4;
        do {
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar4);
          iVar2 = local_50.dx_.num_elts;
          iVar3 = local_70.dx_.num_elts;
          local_a8.val_ = local_70.val_ / local_50.val_;
          uVar1 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_70.dx_.num_elts) {
            uVar1 = local_70.dx_.num_elts;
          }
          local_a8.dx_.num_elts = 0;
          local_a8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            uVar6 = (ulong)uVar1;
            local_a8.dx_.num_elts = uVar1;
            local_a8.dx_.ptr_to_data = (double *)operator_new__(uVar6 * 8);
            if (0 < (int)uVar1) {
              lVar4 = 0;
              do {
                pdVar5 = (double *)((long)local_70.dx_.ptr_to_data + lVar4);
                if (iVar3 == 0) {
                  pdVar5 = &local_70.defaultVal;
                }
                pdVar7 = (double *)((long)local_50.dx_.ptr_to_data + lVar4);
                if (iVar2 == 0) {
                  pdVar7 = &local_50.defaultVal;
                }
                *(double *)((long)local_a8.dx_.ptr_to_data + lVar4) =
                     (*pdVar5 * local_50.val_ - local_70.val_ * *pdVar7) /
                     (local_50.val_ * local_50.val_);
                lVar4 = lVar4 + 8;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          lVar4 = local_78;
          B = local_80;
          local_a8.defaultVal = 0.0;
          (*(local_80->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_80,local_78,lVar8,&local_a8);
          Fad<double>::~Fad(&local_a8);
          Fad<double>::~Fad(&local_70);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
      }
      Fad<double>::~Fad(&local_50);
      this = local_88;
      lVar4 = lVar4 + 1;
      iVar3 = (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_88);
    } while (lVar4 < CONCAT44(extraout_var_01,iVar3));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}